

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

Result * __thiscall
httplib::ClientImpl::Post
          (Result *__return_storage_ptr__,ClientImpl *this,char *path,Headers *headers,string *body,
          char *content_type)

{
  char *body_00;
  size_t content_length;
  function<bool_(unsigned_long,_httplib::DataSink_&)> local_80;
  function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> local_60;
  char *local_40;
  char *content_type_local;
  string *body_local;
  Headers *headers_local;
  char *path_local;
  ClientImpl *this_local;
  
  local_40 = content_type;
  content_type_local = (char *)body;
  body_local = (string *)headers;
  headers_local = (Headers *)path;
  path_local = (char *)this;
  this_local = (ClientImpl *)__return_storage_ptr__;
  body_00 = (char *)std::__cxx11::string::data();
  content_length = std::__cxx11::string::size();
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::function
            (&local_60,(nullptr_t)0x0);
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::function(&local_80,(nullptr_t)0x0);
  send_with_content_provider
            (__return_storage_ptr__,this,"POST",path,headers,body_00,content_length,&local_60,
             &local_80,local_40);
  std::function<bool_(unsigned_long,_httplib::DataSink_&)>::~function(&local_80);
  std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::~function(&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::Post(const char *path, const Headers &headers,
                               const std::string &body,
                               const char *content_type) {
  return send_with_content_provider("POST", path, headers, body.data(),
                                    body.size(), nullptr, nullptr,
                                    content_type);
}